

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_qsort_template.h
# Opt level: O1

void ON_qsort_double(double *base,size_t num)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *lostk [62];
  undefined8 auStack_3e8 [62];
  undefined8 auStack_1f8 [63];
  
  if (num < 2 || base == (double *)0x0) {
    return;
  }
  uVar3 = 0;
  pdVar4 = base + (num - 1);
LAB_005bb3b5:
  while( true ) {
    iVar2 = (int)uVar3;
    uVar5 = ((long)pdVar4 - (long)base >> 3) + 1;
    if (uVar5 < 9) break;
    pdVar7 = (double *)((long)base + (uVar5 & 0xfffffffffffffffe) * 4);
    dVar1 = *base;
    if (*pdVar7 < dVar1) {
      *base = *pdVar7;
      *pdVar7 = dVar1;
    }
    dVar1 = *base;
    if (*pdVar4 < dVar1) {
      *base = *pdVar4;
      *pdVar4 = dVar1;
    }
    dVar1 = *pdVar7;
    pdVar6 = base;
    pdVar8 = pdVar4;
    if (*pdVar4 < dVar1) {
      *pdVar7 = *pdVar4;
      *pdVar4 = dVar1;
    }
LAB_005bb41c:
    if (pdVar6 < pdVar7) {
      do {
        pdVar6 = pdVar6 + 1;
        if (pdVar7 <= pdVar6) break;
      } while (*pdVar6 <= *pdVar7);
    }
    if (pdVar7 <= pdVar6) {
      do {
        pdVar6 = pdVar6 + 1;
        if (pdVar4 < pdVar6) break;
      } while (*pdVar6 <= *pdVar7);
    }
    do {
      pdVar9 = pdVar8;
      pdVar8 = pdVar9 + -1;
      if (pdVar8 <= pdVar7) break;
    } while (*pdVar7 <= *pdVar8 && *pdVar8 != *pdVar7);
    if (pdVar6 <= pdVar8) {
      dVar1 = *pdVar6;
      *pdVar6 = *pdVar8;
      *pdVar8 = dVar1;
      if (pdVar8 == pdVar7) {
        pdVar7 = pdVar6;
      }
      goto LAB_005bb41c;
    }
    if (pdVar7 < pdVar9) {
      while (pdVar9 = pdVar8, pdVar7 < pdVar9) {
        if ((*pdVar9 != *pdVar7) || (pdVar8 = pdVar9 + -1, NAN(*pdVar9) || NAN(*pdVar7))) break;
      }
    }
    if (pdVar9 <= pdVar7) {
      while (pdVar9 = pdVar9 + -1, base < pdVar9) {
        if ((*pdVar9 != *pdVar7) || (NAN(*pdVar9) || NAN(*pdVar7))) break;
      }
    }
    if ((long)pdVar9 - (long)base < (long)pdVar4 - (long)pdVar6) goto LAB_005bb56e;
    if (base < pdVar9) {
      auStack_1f8[iVar2] = base;
      auStack_3e8[iVar2] = pdVar9;
      uVar3 = (ulong)(iVar2 + 1);
    }
    iVar2 = (int)uVar3;
    base = pdVar6;
    if (pdVar4 <= pdVar6) goto LAB_005bb591;
  }
  for (; pdVar6 = base, pdVar7 = base, base < pdVar4; pdVar4 = pdVar4 + -1) {
    while (pdVar8 = pdVar6, pdVar7 = pdVar7 + 1, pdVar7 <= pdVar4) {
      pdVar6 = pdVar7;
      if (*pdVar7 < *pdVar8 || *pdVar7 == *pdVar8) {
        pdVar6 = pdVar8;
      }
    }
    dVar1 = *pdVar8;
    *pdVar8 = *pdVar4;
    *pdVar4 = dVar1;
  }
  goto LAB_005bb591;
LAB_005bb56e:
  if (pdVar6 < pdVar4) {
    auStack_1f8[iVar2] = pdVar6;
    auStack_3e8[iVar2] = pdVar4;
    uVar3 = (ulong)(iVar2 + 1);
  }
  iVar2 = (int)uVar3;
  pdVar4 = pdVar9;
  if (pdVar9 <= base) {
LAB_005bb591:
    if (iVar2 < 1) {
      return;
    }
    uVar3 = (ulong)(iVar2 - 1);
    base = (double *)auStack_1f8[uVar3];
    pdVar4 = (double *)auStack_3e8[uVar3];
  }
  goto LAB_005bb3b5;
}

Assistant:

void 
ON_QSORT_FNAME (
    ON_SORT_TEMPLATE_TYPE *base,
    size_t num
    )
{
  ON_SORT_TEMPLATE_TYPE *lo;                   /* start of sub-array currently sorting */
  ON_SORT_TEMPLATE_TYPE *hi;                   /* end of sub-array currently sorting */
  ON_SORT_TEMPLATE_TYPE *mid;                  /* points to middle of subarray */
  ON_SORT_TEMPLATE_TYPE *loguy;                /* traveling pointers for partition step */
  ON_SORT_TEMPLATE_TYPE *higuy;                /* traveling pointers for partition step */
  ON_SORT_TEMPLATE_TYPE *lostk[ON_QSORT_STKSIZ];
  ON_SORT_TEMPLATE_TYPE *histk[ON_QSORT_STKSIZ];
  size_t size;                /* size of the sub-array */
  int stkptr;                 /* stack for saving sub-array to be processed */
  ON_SORT_TEMPLATE_TYPE tmp;

  if ( 0 == base || num < 2 )
    return;

  stkptr = 0;                 /* initialize stack */

  lo = base;
  hi = base + (num-1);        /* initialize limits */

  /* this entry point is for pseudo-recursion calling: setting
      lo and hi and jumping to here is like recursion, but stkptr is
      preserved, locals aren't, so we preserve stuff on the stack */
recurse:

  size = (hi - lo) + 1;        /* number of el's to sort */

  /* below a certain size, it is faster to use a O(n^2) sorting method */
  if (size <= ON_QSORT_CUTOFF) 
  {
      ON_QSORT_SHORT_SORT_FNAME(lo, hi);
  }
  else {
    /* First we pick a partitioning element.  The efficiency of the
        algorithm demands that we find one that is approximately the median
        of the values, but also that we select one fast.  We choose the
        median of the first, middle, and last elements, to avoid bad
        performance in the face of already sorted data, or data that is made
        up of multiple sorted runs appended together.  Testing shows that a
        median-of-three algorithm provides better performance than simply
        picking the middle element for the latter case. */

    mid = lo + (size / 2);      /* find middle element */

    /* Sort the first, middle, last elements into order */
    if ( ON_QSORT_GT(lo,mid) ) {ON_QSORT_SWAP(lo,mid);}
    if ( ON_QSORT_GT(lo,hi)  ) {ON_QSORT_SWAP(lo,hi);}
    if ( ON_QSORT_GT(mid,hi) ) {ON_QSORT_SWAP(mid,hi);}

    /* We now wish to partition the array into three pieces, one consisting
        of elements <= partition element, one of elements equal to the
        partition element, and one of elements > than it.  This is done
        below; comments indicate conditions established at every step. */

    loguy = lo;
    higuy = hi;

    /* Note that higuy decreases and loguy increases on every iteration,
        so loop must terminate. */
    for (;;)
    {
      /* lo <= loguy < hi, lo < higuy <= hi,
          A[i] <= A[mid] for lo <= i <= loguy,
          A[i] > A[mid] for higuy <= i < hi,
          A[hi] >= A[mid] */

      /* The doubled loop is to avoid calling comp(mid,mid), since some
          existing comparison funcs don't work when passed the same
          value for both pointers. */

      if (mid > loguy) 
      {
          do  {
              loguy++;
          } while (loguy < mid && ON_QSORT_LE(loguy,mid));
      }
      if (mid <= loguy) 
      {
          do  {
              loguy++;
          } while (loguy <= hi && ON_QSORT_LE(loguy,mid));
      }

      /* lo < loguy <= hi+1, A[i] <= A[mid] for lo <= i < loguy,
          either loguy > hi or A[loguy] > A[mid] */

      do  {
          higuy--;
      } while (higuy > mid && ON_QSORT_GT(higuy,mid));

      /* lo <= higuy < hi, A[i] > A[mid] for higuy < i < hi,
          either higuy == lo or A[higuy] <= A[mid] */

      if (higuy < loguy)
          break;

      /* if loguy > hi or higuy == lo, then we would have exited, so
          A[loguy] > A[mid], A[higuy] <= A[mid],
          loguy <= hi, higuy > lo */

      ON_QSORT_SWAP(loguy,higuy);

      /* If the partition element was moved, follow it.  Only need
          to check for mid == higuy, since before the swap,
          A[loguy] > A[mid] implies loguy != mid. */

      if (mid == higuy)
          mid = loguy;

      /* A[loguy] <= A[mid], A[higuy] > A[mid]; so condition at top
          of loop is re-established */
    }

    /*     A[i] <= A[mid] for lo <= i < loguy,
            A[i] > A[mid] for higuy < i < hi,
            A[hi] >= A[mid]
            higuy < loguy
        implying:
            higuy == loguy-1
            or higuy == hi - 1, loguy == hi + 1, A[hi] == A[mid] */

    /* Find adjacent elements equal to the partition element.  The
        doubled loop is to avoid calling comp(mid,mid), since some
        existing comparison funcs don't work when passed the same value
        for both pointers. */

    higuy++;
    if (mid < higuy) {
        do  {
            higuy--;
        } while (higuy > mid && ON_QSORT_EQ(higuy,mid));
    }
    if (mid >= higuy) {
        do  {
            higuy--;
        } while (higuy > lo && ON_QSORT_EQ(higuy,mid));
    }

    /* OK, now we have the following:
          higuy < loguy
          lo <= higuy <= hi
          A[i]  <= A[mid] for lo <= i <= higuy
          A[i]  == A[mid] for higuy < i < loguy
          A[i]  >  A[mid] for loguy <= i < hi
          A[hi] >= A[mid] */

    /* We've finished the partition, now we want to sort the subarrays
        [lo, higuy] and [loguy, hi].
        We do the smaller one first to minimize stack usage.
        We only sort arrays of length 2 or more.*/

    if ( higuy - lo >= hi - loguy ) {
        if (lo < higuy) {
            lostk[stkptr] = lo;
            histk[stkptr] = higuy;
            ++stkptr;
        }                           /* save big recursion for later */

        if (loguy < hi) {
            lo = loguy;
            goto recurse;           /* do small recursion */
        }
    }
    else {
        if (loguy < hi) {
            lostk[stkptr] = loguy;
            histk[stkptr] = hi;
            ++stkptr;               /* save big recursion for later */
        }

        if (lo < higuy) {
            hi = higuy;
            goto recurse;           /* do small recursion */
        }
    }
  }

  /* We have sorted the array, except for any pending sorts on the stack.
      Check if there are any, and do them. */

  --stkptr;
  if (stkptr >= 0) {
      lo = lostk[stkptr];
      hi = histk[stkptr];
      goto recurse;           /* pop subarray from stack */
  }
  else
      return;                 /* all subarrays done */
}